

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileClasses.cpp
# Opt level: O3

char32_t __thiscall TextFile::readCharacter(TextFile *this)

{
  size_t sVar1;
  byte bVar2;
  unsigned_short SjisCharacter;
  ushort uVar3;
  optional<char16_t> oVar4;
  char32_t cVar5;
  ulong uVar6;
  size_t *psVar7;
  string *psVar8;
  uint uVar9;
  char32_t cVar10;
  char *fmt;
  int iVar11;
  uint uVar12;
  size_t *psVar13;
  string local_70;
  size_t *local_50;
  string *local_48;
  string *local_40;
  string *local_38;
  
  cVar10 = L'\0';
  switch(this->encoding) {
  case ASCII:
    if (this->fromMemory == true) {
      psVar8 = &this->content;
      psVar13 = &this->contentPos;
      uVar6 = this->contentPos;
LAB_00150a03:
      *psVar13 = uVar6 + 1;
      cVar10 = (char32_t)(byte)(psVar8->_M_dataplus)._M_p[uVar6];
    }
    else {
      psVar13 = &this->bufPos;
      uVar6 = this->bufPos;
      if (uVar6 < (this->buf)._M_string_length) {
LAB_001509f5:
        psVar8 = &this->buf;
        this->contentPos = this->contentPos + 1;
        goto LAB_00150a03;
      }
      bufFillRead(this);
      if ((this->buf)._M_string_length != 0) {
        uVar6 = *psVar13;
        goto LAB_001509f5;
      }
      cVar10 = L'\0';
    }
    this->contentPos = this->contentPos + 1;
    break;
  case UTF8:
    if (this->fromMemory == true) {
      psVar8 = &this->content;
      psVar13 = &this->contentPos;
      uVar6 = this->contentPos;
    }
    else {
      psVar13 = &this->bufPos;
      uVar6 = this->bufPos;
      if ((this->buf)._M_string_length <= uVar6) {
        bufFillRead(this);
        if ((this->buf)._M_string_length == 0) {
          return L'\0';
        }
        uVar6 = *psVar13;
      }
      psVar8 = &this->buf;
      this->contentPos = this->contentPos + 1;
    }
    *psVar13 = uVar6 + 1;
    bVar2 = (psVar8->_M_dataplus)._M_p[uVar6];
    cVar10 = (char32_t)bVar2;
    if ((cVar10 & 0xffffffe0U) == 0xc0) {
      iVar11 = 1;
      uVar12 = 0x1f;
    }
    else {
      if ((cVar10 & 0xfffffff0U) != 0xe0) {
        if ((char)bVar2 < '\0') {
          tinyformat::format<>(&local_70,"One or more invalid UTF-8 characters in this file");
          std::__cxx11::string::operator=((string *)&this->errorText,(string *)&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
        }
        break;
      }
      iVar11 = 2;
      uVar12 = 0xf;
    }
    cVar10 = cVar10 & uVar12;
    local_48 = &this->buf;
    local_50 = &this->bufPos;
    psVar13 = &this->contentPos;
    local_40 = &this->content;
    local_38 = (string *)&this->errorText;
    do {
      if (this->fromMemory == true) {
        uVar6 = *psVar13;
        psVar7 = psVar13;
        psVar8 = local_40;
LAB_00150b29:
        *psVar7 = uVar6 + 1;
        uVar12 = (uint)(byte)(psVar8->_M_dataplus)._M_p[uVar6];
        if ((uVar12 & 0xffffffc0) != 0x80) goto LAB_00150b45;
      }
      else {
        uVar6 = this->bufPos;
        if (uVar6 < (this->buf)._M_string_length) {
LAB_00150b1b:
          *psVar13 = *psVar13 + 1;
          psVar7 = local_50;
          psVar8 = local_48;
          goto LAB_00150b29;
        }
        bufFillRead(this);
        if ((this->buf)._M_string_length != 0) {
          uVar6 = *local_50;
          goto LAB_00150b1b;
        }
        uVar12 = 0;
LAB_00150b45:
        tinyformat::format<>(&local_70,"One or more invalid UTF-8 characters in this file");
        std::__cxx11::string::operator=(local_38,(string *)&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
      cVar10 = cVar10 << 6 | uVar12 & 0x3f;
      iVar11 = iVar11 + -1;
    } while (iVar11 != 0);
    break;
  case UTF16LE:
    if (this->fromMemory == true) {
      psVar8 = &this->content;
      psVar13 = &this->contentPos;
      uVar6 = this->contentPos;
LAB_0015087d:
      *psVar13 = uVar6 + 1;
      uVar12 = (uint)(byte)(psVar8->_M_dataplus)._M_p[uVar6];
    }
    else {
      psVar13 = &this->bufPos;
      uVar6 = this->bufPos;
      if (uVar6 < (this->buf)._M_string_length) {
LAB_0015086f:
        psVar8 = &this->buf;
        this->contentPos = this->contentPos + 1;
        goto LAB_0015087d;
      }
      bufFillRead(this);
      if ((this->buf)._M_string_length != 0) {
        uVar6 = *psVar13;
        goto LAB_0015086f;
      }
      uVar12 = 0;
    }
    if (this->fromMemory == true) {
      psVar8 = &this->content;
      psVar13 = &this->contentPos;
      uVar6 = this->contentPos;
    }
    else {
      psVar13 = &this->bufPos;
      uVar6 = this->bufPos;
      if ((this->buf)._M_string_length <= uVar6) {
        bufFillRead(this);
        if ((this->buf)._M_string_length == 0) goto LAB_00150bee;
        uVar6 = *psVar13;
      }
      psVar8 = &this->buf;
      this->contentPos = this->contentPos + 1;
    }
    *psVar13 = uVar6 + 1;
    uVar9 = (uint)(byte)(psVar8->_M_dataplus)._M_p[uVar6] << 8;
    goto LAB_001509bd;
  case UTF16BE:
    if (this->fromMemory == true) {
      psVar8 = &this->content;
      psVar13 = &this->contentPos;
      uVar6 = this->contentPos;
LAB_0015093e:
      *psVar13 = uVar6 + 1;
      uVar12 = (uint)(byte)(psVar8->_M_dataplus)._M_p[uVar6] << 8;
    }
    else {
      psVar13 = &this->bufPos;
      uVar6 = this->bufPos;
      if (uVar6 < (this->buf)._M_string_length) {
LAB_00150930:
        psVar8 = &this->buf;
        this->contentPos = this->contentPos + 1;
        goto LAB_0015093e;
      }
      bufFillRead(this);
      if ((this->buf)._M_string_length != 0) {
        uVar6 = *psVar13;
        goto LAB_00150930;
      }
      uVar12 = 0;
    }
    if (this->fromMemory == true) {
      psVar8 = &this->content;
      psVar13 = &this->contentPos;
      uVar6 = this->contentPos;
LAB_001509af:
      *psVar13 = uVar6 + 1;
      uVar9 = (uint)(byte)(psVar8->_M_dataplus)._M_p[uVar6];
    }
    else {
      psVar13 = &this->bufPos;
      uVar6 = this->bufPos;
      if (uVar6 < (this->buf)._M_string_length) {
LAB_001509a1:
        psVar8 = &this->buf;
        this->contentPos = this->contentPos + 1;
        goto LAB_001509af;
      }
      bufFillRead(this);
      if ((this->buf)._M_string_length != 0) {
        uVar6 = *psVar13;
        goto LAB_001509a1;
      }
LAB_00150bee:
      uVar9 = 0;
    }
LAB_001509bd:
    cVar10 = uVar9 | uVar12;
    break;
  case SJIS:
    if (this->fromMemory == true) {
      psVar8 = &this->content;
      psVar13 = &this->contentPos;
      uVar6 = this->contentPos;
LAB_001507fa:
      *psVar13 = uVar6 + 1;
      bVar2 = (psVar8->_M_dataplus)._M_p[uVar6];
      SjisCharacter = (unsigned_short)bVar2;
      if ((char)bVar2 < '\0') {
        if (this->fromMemory == true) {
          psVar8 = &this->content;
          psVar13 = &this->contentPos;
          uVar6 = this->contentPos;
LAB_00150c33:
          *psVar13 = uVar6 + 1;
          uVar3 = (ushort)(byte)(psVar8->_M_dataplus)._M_p[uVar6];
        }
        else {
          psVar13 = &this->bufPos;
          uVar6 = this->bufPos;
          if (uVar6 < (this->buf)._M_string_length) {
LAB_00150c25:
            psVar8 = &this->buf;
            this->contentPos = this->contentPos + 1;
            goto LAB_00150c33;
          }
          bufFillRead(this);
          if ((this->buf)._M_string_length != 0) {
            uVar6 = *psVar13;
            goto LAB_00150c25;
          }
          uVar3 = 0;
        }
        SjisCharacter = uVar3 | (ushort)bVar2 << 8;
      }
    }
    else {
      psVar13 = &this->bufPos;
      uVar6 = this->bufPos;
      if (uVar6 < (this->buf)._M_string_length) {
LAB_001507ec:
        psVar8 = &this->buf;
        this->contentPos = this->contentPos + 1;
        goto LAB_001507fa;
      }
      bufFillRead(this);
      if ((this->buf)._M_string_length != 0) {
        uVar6 = *psVar13;
        goto LAB_001507ec;
      }
      SjisCharacter = 0;
    }
    oVar4 = sjisToUnicode(SjisCharacter);
    if (((uint)oVar4.super__Optional_base<char16_t,_true,_true>._M_payload.
               super__Optional_payload_base<char16_t> >> 0x10 & 1) == 0) {
      fmt = "One or more invalid Shift-JIS characters in this file";
      goto LAB_00150c60;
    }
    cVar10 = (uint)oVar4.super__Optional_base<char16_t,_true,_true>._M_payload.
                   super__Optional_payload_base<char16_t> & 0xffff;
    break;
  case GUESS:
    fmt = "Cannot read from GUESS encoding";
LAB_00150c60:
    tinyformat::format<>(&local_70,fmt);
    std::__cxx11::string::operator=((string *)&this->errorText,(string *)&local_70);
    cVar10 = L'\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  default:
    goto switchD_001506eb_default;
  }
  if ((cVar10 == L'\r') && (cVar10 = L'\r', this->recursion == false)) {
    if (this->fromMemory == false) {
      bVar2 = std::__basic_file<char>::is_open();
      bVar2 = bVar2 ^ 1;
    }
    else {
      bVar2 = 0;
    }
    sVar1 = this->contentPos;
    if (((bVar2 != 0) || (this->mode != Read)) || ((long)sVar1 < this->size_)) {
      this->recursion = true;
      cVar5 = readCharacter(this);
      this->recursion = false;
      cVar10 = L'\n';
      if (cVar5 != L'\n') {
        if (this->fromMemory == true) {
          this->contentPos = sVar1;
        }
        else {
          std::istream::seekg(this,sVar1,0);
        }
        cVar10 = L'\r';
      }
    }
  }
switchD_001506eb_default:
  return cVar10;
}

Assistant:

char32_t TextFile::readCharacter()
{
	char32_t value = 0;

	switch (encoding)
	{
	case UTF8:
		{
			value = bufGetChar();
			
			int extraBytes = 0;
			if ((value & 0xE0) == 0xC0)
			{
				extraBytes = 1;
				value &= 0x1F;
			} else if ((value & 0xF0) == 0xE0)
			{
				extraBytes = 2;
				value &= 0x0F;
			} else if (value > 0x7F)
			{
				errorText = tfm::format("One or more invalid UTF-8 characters in this file");
			}

			for (int i = 0; i < extraBytes; i++)
			{
				int b = bufGetChar();
				if ((b & 0xC0) != 0x80)
				{
					errorText = tfm::format("One or more invalid UTF-8 characters in this file");
				}

				value = (value << 6) | (b & 0x3F);
			}
		}
		break;
	case UTF16LE:
		value = bufGet16LE();
		break;
	case UTF16BE:
		value = bufGet16BE();
		break;
	case SJIS:
		{
			unsigned short sjis = bufGetChar();
			if (sjis >= 0x80)
				sjis = (sjis << 8) | bufGetChar();

			if (auto unicode = sjisToUnicode(sjis))
				value = *unicode;
			else
				errorText = tfm::format("One or more invalid Shift-JIS characters in this file");
		}
		break;
	case ASCII:
		value = bufGetChar();
		contentPos++;
		break;

	case GUESS:
		errorText = tfm::format("Cannot read from GUESS encoding");
		break;
	}

	// convert \r\n to \n
	if (value == L'\r' && !recursion && !atEnd())
	{
		recursion = true;
		long pos = tell();
		char32_t nextValue = readCharacter();
		recursion = false;

		if (nextValue == L'\n')
			return nextValue;
		seek(pos);
	}

	return value;
}